

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nonstd::sv_lite::basic_string_view::operator_cast_to_string
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view *this)

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string_view *local_18;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_18 = this;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (&local_38,(basic_string_view<char,std::char_traits<char>> *)this,&local_39);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

explicit operator std::basic_string<CharT, Traits, Allocator>() const
    {
        return to_string( Allocator() );
    }